

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

bool __thiscall
Inline::InlineCallTarget
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlinerData,
          FunctionJITTimeInfo **pInlineeData,FunctionJITTimeInfo *callFuncInfo,
          StackSym *symCallerThis,Instr **returnInstr,uint recursiveInlineDepth,
          bool isCallInstanceFunction)

{
  code *pcVar1;
  FunctionJITTimeInfo *pFVar2;
  bool bVar3;
  bool bVar4;
  OpndKind OVar5;
  BuiltinFunction builtInId;
  uint localFuncId;
  Instr *pIVar6;
  undefined4 *puVar7;
  Instr *pIVar8;
  RegOpnd *this_00;
  StackSym *pSVar9;
  FunctionJITTimeInfo *inlineeData_00;
  undefined1 safeThis;
  Instr *local_a0;
  Instr *callLdInstr;
  Instr *callTargetLdInstr;
  FunctionJITTimeInfo *inlineeData;
  Instr *callbackDefInstr;
  ulong local_78;
  StackSym *local_70;
  InlineCacheIndex local_64;
  Instr *pIStack_60;
  InlineCacheIndex inlineCacheIndex;
  Instr *local_58;
  Instr *explicitThisArgOut;
  Instr *local_48;
  Instr *local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  CallApplyTargetSourceType local_32;
  byte local_31;
  ValueType returnType;
  CallApplyTargetSourceType targetType;
  
  local_a0 = (Instr *)0x0;
  callLdInstr = (Instr *)0x0;
  explicitThisArgOut = (Instr *)callFuncInfo;
  local_40 = (Instr *)pInlineeData;
  bVar3 = TryGetCallApplyAndTargetLdInstrs(this,callInstr,&local_a0,&callLdInstr);
  if (!bVar3) {
    return false;
  }
  callTargetLdInstr = (Instr *)0x0;
  local_64 = 0xffffffff;
  inlineeData = (FunctionJITTimeInfo *)0x0;
  local_32 = None;
  local_78 = (ulong)isCallInstanceFunction;
  pIStack_60 = local_a0;
  local_48 = callLdInstr;
  local_70 = symCallerThis;
  bVar3 = TryGetCallApplyInlineeData
                    (this,inlinerData,callInstr,local_a0,callLdInstr,
                     (FunctionJITTimeInfo **)&callTargetLdInstr,&local_64,(Instr **)&inlineeData,
                     isCallInstanceFunction,&local_32);
  pIVar6 = callTargetLdInstr;
  if (!bVar3) {
    return false;
  }
  bVar3 = SkipCallApplyScriptTargetInlining_Shared
                    (this,callInstr,inlinerData,(FunctionJITTimeInfo *)callTargetLdInstr,false,true)
  ;
  pFVar2 = inlineeData;
  if (bVar3) {
    *(Instr **)local_40 = pIVar6;
    return false;
  }
  local_40 = (Instr *)inlinerData;
  bVar3 = FunctionJITTimeInfo::HasBody((FunctionJITTimeInfo *)pIVar6);
  if (!bVar3) {
    if (pFVar2 != (FunctionJITTimeInfo *)0x0) {
      return false;
    }
    ValueType::ValueType((ValueType *)&local_34.field_0);
    InliningDecider::GetBuiltInInfo
              ((FunctionJITTimeInfo *)pIVar6,(OpCode *)&local_58,(ValueType *)&local_34.field_0);
    localFuncId = FunctionJITTimeInfo::GetLocalFunctionId((FunctionJITTimeInfo *)pIVar6);
    builtInId = Js::JavascriptLibrary::GetBuiltInForFuncInfo(localFuncId);
    pIVar8 = local_40;
    if ((byte)(builtInId._value - 0x3c) < 3) {
      return false;
    }
    bVar3 = CanInlineBuiltInFunction
                      (this,callInstr,inlineeData_00,(OpCode)local_58,
                       (FunctionJITTimeInfo *)local_40,builtInId,true);
    if (!bVar3) {
      return false;
    }
    bVar3 = InlineCallBuiltInTarget
                      (this,callInstr,(FunctionJITTimeInfo *)pIVar8,(FunctionJITTimeInfo *)pIVar6,
                       (FunctionJITTimeInfo *)explicitThisArgOut,local_48,(OpCode)local_58,local_70,
                       recursiveInlineDepth,SUB81(local_78,0),returnInstr);
    return bVar3;
  }
  callbackDefInstr = (Instr *)IR::Opnd::GetStackSym(callInstr->m_src1);
  pIVar8 = local_40;
  local_31 = callInstr->m_src1->field_0xb;
  local_34.bits._0_1_ = '\0';
  local_40 = pIVar6;
  pIVar6 = TryGetFixedMethodsForBuiltInAndTarget
                     (this,callInstr,(FunctionJITTimeInfo *)pIVar8,(FunctionJITTimeInfo *)pIVar6,
                      (FunctionJITTimeInfo *)explicitThisArgOut,pIStack_60,local_48,
                      (bool *)&local_34,false,pFVar2 != (FunctionJITTimeInfo *)0x0);
  bVar3 = pIVar6 != (Instr *)0x0;
  if (pIVar6 == (Instr *)0x0) {
    return bVar3;
  }
  local_48 = (Instr *)pFVar2;
  local_58 = (Instr *)0x0;
  explicitThisArgOut = (Instr *)this;
  AdjustArgoutsForCallTargetInlining(this,callInstr,&local_58,SUB81(local_78,0));
  if (local_58 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xd5d,"(explicitThisArgOut)","explicitThisArgOut");
    if (!bVar4) goto LAB_00554036;
    *puVar7 = 0;
  }
  safeThis = local_34.bits._0_1_;
  if (local_34.bits._0_1_ == '\x01') {
    pIVar8 = IR::Instr::GetBytecodeArgOutCapture(local_58);
    OVar5 = IR::Opnd::GetKind(pIVar8->m_src1);
    if (OVar5 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      pIStack_60 = (Instr *)__tls_get_addr(&PTR_01548f08);
      *(undefined4 *)&pIStack_60->_vptr_Instr = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0xd62,"(byteCodeArgOutCapture->GetSrc1()->IsRegOpnd())",
                         "byteCodeArgOutCapture->GetSrc1()->IsRegOpnd()");
      if (!bVar4) {
LAB_00554036:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)&pIStack_60->_vptr_Instr = 0;
    }
    this_00 = IR::Opnd::AsRegOpnd(pIVar8->m_src1);
    pSVar9 = IR::Opnd::GetStackSym(&this_00->super_Opnd);
    if (pSVar9 != local_70) {
      safeThis = false;
    }
  }
  pIVar6 = InlineCallApplyTarget_Shared
                     ((Inline *)explicitThisArgOut,callInstr,(bool)((local_31 & 8) >> 3),
                      (StackSym *)callbackDefInstr,(FunctionJITTimeInfo *)local_40,local_64,
                      (bool)safeThis,false,local_32,local_48,recursiveInlineDepth,pIVar6);
  *returnInstr = pIVar6;
  return bVar3;
}

Assistant:

bool
Inline::InlineCallTarget(IR::Instr *callInstr, const FunctionJITTimeInfo* inlinerData, const FunctionJITTimeInfo** pInlineeData, const FunctionJITTimeInfo *callFuncInfo,
                            const StackSym *symCallerThis, IR::Instr ** returnInstr, uint recursiveInlineDepth, bool isCallInstanceFunction)
{
    IR::Instr* callLdInstr = nullptr;
    IR::Instr* callTargetLdInstr = nullptr;
    if (!TryGetCallApplyAndTargetLdInstrs(callInstr, &callLdInstr, &callTargetLdInstr))
    {
        return false;
    }

    const FunctionJITTimeInfo * inlineeData = nullptr;
    Js::InlineCacheIndex inlineCacheIndex = Js::Constants::NoInlineCacheIndex;
    IR::Instr * callbackDefInstr = nullptr;
    CallApplyTargetSourceType targetType = CallApplyTargetSourceType::None;
    if (!TryGetCallApplyInlineeData(inlinerData, callInstr, callLdInstr, callTargetLdInstr, &inlineeData, &inlineCacheIndex, &callbackDefInstr, isCallInstanceFunction, &targetType))
    {
        return false;
    }

    if (SkipCallApplyScriptTargetInlining_Shared(callInstr, inlinerData, inlineeData, /*isApplyTarget*/ false, /*isCallTarget*/ true))
    {
        *pInlineeData = inlineeData;
        return false;
    }

    const bool targetIsCallback = callbackDefInstr != nullptr;

    if (!inlineeData->HasBody())
    {
        if (targetIsCallback)
        {
            return false;
        }

        Js::OpCode builtInInlineOpCode;
        ValueType returnType;
        InliningDecider::GetBuiltInInfo(inlineeData, &builtInInlineOpCode, &returnType);
        Js::BuiltinFunction builtInId = Js::JavascriptLibrary::GetBuiltInForFuncInfo(inlineeData->GetLocalFunctionId());
        switch (builtInId)
        {
        default:
        {
            if (CanInlineBuiltInFunction(callInstr, inlineeData, builtInInlineOpCode, inlinerData, builtInId, true))
            {
                return InlineCallBuiltInTarget(callInstr, inlinerData, inlineeData, callFuncInfo, callTargetLdInstr, builtInInlineOpCode, symCallerThis, recursiveInlineDepth, isCallInstanceFunction, returnInstr);
            }
        }
        case Js::BuiltinFunction::JavascriptFunction_Apply:
        case Js::BuiltinFunction::JavascriptFunction_Call:
        case Js::BuiltinFunction::EngineInterfaceObject_CallInstanceFunction:
            return false;
        }
    }

    StackSym* originalCallTargetStackSym = callInstr->GetSrc1()->GetStackSym();
    bool originalCallTargetOpndIsJITOpt = callInstr->GetSrc1()->GetIsJITOptimizedReg();
    bool safeThis = false;

    IR::Instr * funcObjCheckInsertInstr = TryGetFixedMethodsForBuiltInAndTarget(callInstr, inlinerData, inlineeData, callFuncInfo, callLdInstr, callTargetLdInstr, safeThis, /*isApplyTarget*/ false, targetIsCallback);
    if (!funcObjCheckInsertInstr)
    {
        return false;
    }

    IR::Instr * explicitThisArgOut = nullptr;
    AdjustArgoutsForCallTargetInlining(callInstr, &explicitThisArgOut, isCallInstanceFunction);
    Assert(explicitThisArgOut);

    if (safeThis)
    {
        IR::Instr * byteCodeArgOutCapture = explicitThisArgOut->GetBytecodeArgOutCapture();
        Assert(byteCodeArgOutCapture->GetSrc1()->IsRegOpnd());

        if (byteCodeArgOutCapture->GetSrc1()->AsRegOpnd()->GetStackSym() != symCallerThis)
        {
            safeThis = false;
        }
    }

    *returnInstr = InlineCallApplyTarget_Shared(callInstr, originalCallTargetOpndIsJITOpt, originalCallTargetStackSym, inlineeData, inlineCacheIndex,
        safeThis, /*isApplyTarget*/ false, targetType, callbackDefInstr, recursiveInlineDepth, funcObjCheckInsertInstr);

    return true;
}